

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O0

bool duckdb::IsTriviallyMappable
               (MultiFileColumnDefinition *global_column,
               vector<duckdb::MultiFileColumnDefinition,_true> *local_columns,ColumnMapper *mapper,
               optional_idx expected_idx)

{
  idx_t iVar1;
  bool bVar2;
  optional_idx mapper_00;
  idx_t iVar3;
  size_type sVar4;
  size_type sVar5;
  vector<duckdb::MultiFileColumnDefinition,_true> *in_RDX;
  MultiFileColumnDefinition *in_RSI;
  optional_idx in_RDI;
  bool trivially_mappable;
  value_type *global_child;
  idx_t i;
  unique_ptr<duckdb::ColumnMapper,_std::default_delete<duckdb::ColumnMapper>,_true> nested_mapper;
  value_type *local_column;
  idx_t local_id;
  optional_idx entry;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  const_reference in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  optional_idx *in_stack_ffffffffffffff90;
  ulong local_50;
  undefined1 local_48 [8];
  const_reference local_40;
  idx_t local_38;
  optional_idx local_10;
  byte local_1;
  
  mapper_00.index =
       (**(code **)((long)&(((in_RDX->
                             super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                             ).
                             super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                             ._M_impl.super__Vector_impl_data._M_start)->name).field_2 + 8))
                 (in_RDX,in_RDI.index);
  bVar2 = optional_idx::IsValid((optional_idx *)&stack0xffffffffffffffd0);
  if (bVar2) {
    local_38 = optional_idx::GetIndex(in_stack_ffffffffffffff90);
    bVar2 = optional_idx::IsValid(&local_10);
    iVar1 = local_38;
    if ((bVar2) && (iVar3 = optional_idx::GetIndex(in_stack_ffffffffffffff90), iVar1 != iVar3)) {
      local_1 = 0;
    }
    else {
      local_40 = vector<duckdb::MultiFileColumnDefinition,_true>::operator[]
                           ((vector<duckdb::MultiFileColumnDefinition,_true> *)
                            in_stack_ffffffffffffff50,
                            CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      bVar2 = LogicalType::operator!=
                        ((LogicalType *)in_stack_ffffffffffffff50,
                         (LogicalType *)
                         CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      if (bVar2) {
        local_1 = 0;
      }
      else {
        sVar4 = ::std::
                vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                ::size(&(local_40->children).
                        super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                      );
        sVar5 = ::std::
                vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                ::size((vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                        *)(in_RDI.index + 0x38));
        if (sVar4 == sVar5) {
          (*(code *)(((in_RDX->
                      super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                      ).
                      super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                      ._M_impl.super__Vector_impl_data._M_start)->name).field_2.
                    _M_allocated_capacity)(local_48,in_RDX,&local_40->children);
          for (local_50 = 0;
              sVar4 = ::std::
                      vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                      ::size((vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                              *)(in_RDI.index + 0x38)), local_50 < sVar4; local_50 = local_50 + 1) {
            in_stack_ffffffffffffff50 =
                 vector<duckdb::MultiFileColumnDefinition,_true>::operator[]
                           ((vector<duckdb::MultiFileColumnDefinition,_true> *)
                            in_stack_ffffffffffffff50,
                            CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
            unique_ptr<duckdb::ColumnMapper,_std::default_delete<duckdb::ColumnMapper>,_true>::
            operator*((unique_ptr<duckdb::ColumnMapper,_std::default_delete<duckdb::ColumnMapper>,_true>
                       *)in_stack_ffffffffffffff50);
            optional_idx::optional_idx
                      (in_stack_ffffffffffffff90,
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
            in_stack_ffffffffffffff4f =
                 IsTriviallyMappable(in_RSI,in_RDX,(ColumnMapper *)mapper_00.index,in_RDI);
            if (!(bool)in_stack_ffffffffffffff4f) {
              local_1 = 0;
              goto LAB_0155eb27;
            }
          }
          local_1 = 1;
LAB_0155eb27:
          unique_ptr<duckdb::ColumnMapper,_std::default_delete<duckdb::ColumnMapper>,_true>::
          ~unique_ptr((unique_ptr<duckdb::ColumnMapper,_std::default_delete<duckdb::ColumnMapper>,_true>
                       *)0x155eb31);
        }
        else {
          local_1 = 0;
        }
      }
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool IsTriviallyMappable(const MultiFileColumnDefinition &global_column,
                         const vector<MultiFileColumnDefinition> &local_columns, const ColumnMapper &mapper,
                         optional_idx expected_idx = optional_idx()) {
	auto entry = mapper.Find(global_column);
	if (!entry.IsValid()) {
		return false;
	}
	auto local_id = entry.GetIndex();
	if (expected_idx.IsValid() && local_id != expected_idx.GetIndex()) {
		return false;
	}
	auto &local_column = local_columns[local_id];
	if (local_column.type != global_column.type) {
		return false;
	}
	if (local_column.children.size() != global_column.children.size()) {
		// child count difference - cannot map trivially
		return false;
	}
	auto nested_mapper = mapper.Create(local_column.children);
	for (idx_t i = 0; i < global_column.children.size(); i++) {
		auto &global_child = global_column.children[i];
		bool trivially_mappable = IsTriviallyMappable(global_child, local_column.children, *nested_mapper, i);
		if (!trivially_mappable) {
			return false;
		}
	}
	return true;
}